

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

SEND_ONE_MESSAGE_RESULT
send_one_message(MESSAGE_SENDER_INSTANCE *message_sender,ASYNC_OPERATION_HANDLE pending_send,
                MESSAGE_HANDLE message)

{
  MESSAGE_HANDLE pMVar1;
  _Bool _Var2;
  int iVar3;
  AMQP_VALUE value;
  LOGGER_LOG p_Var4;
  data value_00;
  data value_01;
  undefined8 in_stack_fffffffffffffde8;
  LOGGER_LOG l_26;
  MESSAGE_WITH_CALLBACK *message_with_callback;
  message_annotations pAStack_1e8;
  LINK_TRANSFER_RESULT link_transfer_error;
  ASYNC_OPERATION_HANDLE transfer_async_operation;
  LOGGER_LOG l_25;
  LOGGER_LOG l_24;
  amqp_binary binary_value_1;
  AMQP_VALUE body_amqp_data_1;
  LOGGER_LOG l_23;
  size_t i_1;
  BINARY_DATA binary_data_1;
  LOGGER_LOG l_22;
  LOGGER_LOG l_21;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  PAYLOAD payload;
  void *data_bytes;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  amqp_binary binary_value;
  AMQP_VALUE body_amqp_data;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  size_t i;
  BINARY_DATA binary_data;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  AMQP_VALUE message_body_amqp_value;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE pAStack_90;
  _Bool is_error;
  AMQP_VALUE msg_annotations;
  size_t body_data_count;
  AMQP_VALUE body_amqp_value;
  AMQP_VALUE application_properties_value;
  AMQP_VALUE application_properties;
  AMQP_VALUE properties_amqp_value;
  PROPERTIES_HANDLE properties;
  AMQP_VALUE header_amqp_value;
  HEADER_HANDLE header;
  LOGGER_LOG l;
  message_format message_format;
  MESSAGE_BODY_TYPE message_body_type;
  size_t total_encoded_size;
  size_t encoded_size;
  MESSAGE_HANDLE pMStack_20;
  SEND_ONE_MESSAGE_RESULT result;
  MESSAGE_HANDLE message_local;
  ASYNC_OPERATION_HANDLE pending_send_local;
  MESSAGE_SENDER_INSTANCE *message_sender_local;
  
  _message_format = 0;
  pMStack_20 = message;
  message_local = (MESSAGE_HANDLE)pending_send;
  pending_send_local = (ASYNC_OPERATION_HANDLE)message_sender;
  iVar3 = message_get_body_type(message,(MESSAGE_BODY_TYPE *)((long)&l + 4));
  if ((iVar3 == 0) && (iVar3 = message_get_message_format(pMStack_20,(uint32_t *)&l), iVar3 == 0)) {
    header_amqp_value = (AMQP_VALUE)0x0;
    properties = (PROPERTIES_HANDLE)0x0;
    properties_amqp_value = (AMQP_VALUE)0x0;
    application_properties = (AMQP_VALUE)0x0;
    application_properties_value = (AMQP_VALUE)0x0;
    body_amqp_value = (AMQP_VALUE)0x0;
    body_data_count = 0;
    msg_annotations = (AMQP_VALUE)0x0;
    pAStack_90 = (AMQP_VALUE)0x0;
    l_1._7_1_ = 0;
    iVar3 = message_get_header(pMStack_20,(HEADER_HANDLE *)&header_amqp_value);
    if ((iVar3 == 0) && (header_amqp_value != (AMQP_VALUE)0x0)) {
      properties = (PROPERTIES_HANDLE)amqpvalue_create_header((HEADER_HANDLE)header_amqp_value);
      if ((AMQP_VALUE)properties == (AMQP_VALUE)0x0) {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                 ,"send_one_message",0xfc,1,"Cannot create header AMQP value");
        }
        l_1._7_1_ = 1;
      }
      else {
        iVar3 = amqpvalue_get_encoded_size((AMQP_VALUE)properties,&total_encoded_size);
        if (iVar3 == 0) {
          _message_format = total_encoded_size + _message_format;
        }
        else {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                   ,"send_one_message",0x103,1,"Cannot obtain header encoded size");
          }
          l_1._7_1_ = 1;
        }
      }
    }
    if ((((l_1._7_1_ & 1) == 0) &&
        (iVar3 = message_get_message_annotations(pMStack_20,&stack0xffffffffffffff70), iVar3 == 0))
       && (pAStack_90 != (AMQP_VALUE)0x0)) {
      iVar3 = amqpvalue_get_encoded_size(pAStack_90,&total_encoded_size);
      if (iVar3 == 0) {
        _message_format = total_encoded_size + _message_format;
      }
      else {
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                 ,"send_one_message",0x115,1,"Cannot obtain message annotations encoded size");
        }
        l_1._7_1_ = 1;
      }
    }
    if ((((l_1._7_1_ & 1) == 0) &&
        (iVar3 = message_get_properties(pMStack_20,(PROPERTIES_HANDLE *)&properties_amqp_value),
        iVar3 == 0)) && (properties_amqp_value != (AMQP_VALUE)0x0)) {
      application_properties = amqpvalue_create_properties((PROPERTIES_HANDLE)properties_amqp_value)
      ;
      if (application_properties == (AMQP_VALUE)0x0) {
        l_5 = xlogging_get_log_function();
        if (l_5 != (LOGGER_LOG)0x0) {
          (*l_5)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                 ,"send_one_message",0x126,1,"Cannot create message properties AMQP value");
        }
        l_1._7_1_ = 1;
      }
      else {
        iVar3 = amqpvalue_get_encoded_size(application_properties,&total_encoded_size);
        if (iVar3 == 0) {
          _message_format = total_encoded_size + _message_format;
        }
        else {
          l_6 = xlogging_get_log_function();
          if (l_6 != (LOGGER_LOG)0x0) {
            (*l_6)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                   ,"send_one_message",0x12d,1,"Cannot obtain message properties encoded size");
          }
          l_1._7_1_ = 1;
        }
      }
    }
    if ((((l_1._7_1_ & 1) == 0) &&
        (iVar3 = message_get_application_properties(pMStack_20,&application_properties_value),
        iVar3 == 0)) && (application_properties_value != (AMQP_VALUE)0x0)) {
      body_amqp_value = amqpvalue_create_application_properties(application_properties_value);
      if (body_amqp_value == (AMQP_VALUE)0x0) {
        l_7 = xlogging_get_log_function();
        if (l_7 != (LOGGER_LOG)0x0) {
          (*l_7)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                 ,"send_one_message",0x13f,1,"Cannot create application properties AMQP value");
        }
        l_1._7_1_ = 1;
      }
      else {
        iVar3 = amqpvalue_get_encoded_size(body_amqp_value,&total_encoded_size);
        if (iVar3 == 0) {
          _message_format = total_encoded_size + _message_format;
        }
        else {
          l_8 = xlogging_get_log_function();
          if (l_8 != (LOGGER_LOG)0x0) {
            (*l_8)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                   ,"send_one_message",0x146,1,"Cannot obtain application properties encoded size");
          }
          l_1._7_1_ = 1;
        }
      }
    }
    if ((l_1._7_1_ & 1) == 0) {
      encoded_size._4_4_ = SEND_ONE_MESSAGE_OK;
      if (l._4_4_ == 2) {
        iVar3 = message_get_body_amqp_data_count(pMStack_20,(size_t *)&msg_annotations);
        if (iVar3 == 0) {
          if (msg_annotations == (AMQP_VALUE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",399,1,"Body data count is zero");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          else {
            for (l_12 = (LOGGER_LOG)0x0; l_12 < msg_annotations; l_12 = l_12 + 1) {
              iVar3 = message_get_body_amqp_data_in_place(pMStack_20,(size_t)l_12,(BINARY_DATA *)&i)
              ;
              if (iVar3 == 0) {
                value_00.length = (int)binary_data.bytes;
                value_00.bytes = (void *)i;
                value_00._12_4_ = 0;
                value = amqpvalue_create_data(value_00);
                if (value == (AMQP_VALUE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",0x1a4,1,"Cannot create body AMQP data");
                  }
                  encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
                }
                else {
                  iVar3 = amqpvalue_get_encoded_size(value,&total_encoded_size);
                  if (iVar3 == 0) {
                    _message_format = total_encoded_size + _message_format;
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                ,"send_one_message",0x1ab,1,"Cannot get body AMQP data encoded size"
                               );
                    }
                    encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
                  }
                  amqpvalue_destroy(value);
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  in_stack_fffffffffffffde8 =
                       CONCAT44((int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)l_12);
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x198,1,"Cannot get body AMQP data %u",
                            in_stack_fffffffffffffde8);
                }
                encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
              }
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                      ,"send_one_message",0x188,1,"Cannot get body AMQP data count");
          }
          encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
        }
      }
      else if (l._4_4_ == 4) {
        iVar3 = message_get_body_amqp_value_in_place(pMStack_20,(AMQP_VALUE *)&l_9);
        if (iVar3 == 0) {
          body_data_count = (size_t)amqpvalue_create_amqp_value((AMQP_VALUE)l_9);
          if ((AMQP_VALUE)body_data_count == (AMQP_VALUE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x16d,1,"Cannot create body AMQP value");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          else {
            iVar3 = amqpvalue_get_encoded_size((AMQP_VALUE)body_data_count,&total_encoded_size);
            if (iVar3 == 0) {
              _message_format = total_encoded_size + _message_format;
            }
            else {
              binary_data.length = (size_t)xlogging_get_log_function();
              if ((LOGGER_LOG)binary_data.length != (LOGGER_LOG)0x0) {
                (*(code *)binary_data.length)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                           ,"send_one_message",0x174,1,"Cannot get body AMQP value encoded size");
              }
              encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                      ,"send_one_message",0x165,1,"Cannot obtain AMQP value from body");
          }
          encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
        }
      }
      else {
        message_body_amqp_value = (AMQP_VALUE)xlogging_get_log_function();
        if (message_body_amqp_value != (AMQP_VALUE)0x0) {
          (*(code *)message_body_amqp_value)
                    (0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                     ,"send_one_message",0x15c,1,"Unknown body type");
        }
        encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
      }
      if (encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) {
        l_17 = (LOGGER_LOG)malloc(_message_format);
        payload.bytes = (uchar *)0x0;
        encoded_size._4_4_ = SEND_ONE_MESSAGE_OK;
        payload.length = (size_t)l_17;
        if (header_amqp_value != (AMQP_VALUE)0x0) {
          iVar3 = amqpvalue_encode((AMQP_VALUE)properties,encode_bytes,&l_17);
          if (iVar3 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x1c9,1,"Cannot encode header value");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          log_message_chunk((MESSAGE_SENDER_INSTANCE *)pending_send_local,"Header:",
                            (AMQP_VALUE)properties);
        }
        if ((encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) && (pAStack_90 != (AMQP_VALUE)0x0)) {
          iVar3 = amqpvalue_encode(pAStack_90,encode_bytes,&l_17);
          if (iVar3 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x1d4,1,"Cannot encode message annotations value");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          log_message_chunk((MESSAGE_SENDER_INSTANCE *)pending_send_local,"Message Annotations:",
                            pAStack_90);
        }
        if ((encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) &&
           (properties_amqp_value != (AMQP_VALUE)0x0)) {
          iVar3 = amqpvalue_encode(application_properties,encode_bytes,&l_17);
          if (iVar3 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x1df,1,"Cannot encode message properties value");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          log_message_chunk((MESSAGE_SENDER_INSTANCE *)pending_send_local,"Properties:",
                            application_properties);
        }
        if ((encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) &&
           (application_properties_value != (AMQP_VALUE)0x0)) {
          iVar3 = amqpvalue_encode(body_amqp_value,encode_bytes,&l_17);
          if (iVar3 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x1ea,1,"Cannot encode application properties value");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
          log_message_chunk((MESSAGE_SENDER_INSTANCE *)pending_send_local,"Application properties:",
                            body_amqp_value);
        }
        if (encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) {
          if (l._4_4_ == 2) {
            for (l_23 = (LOGGER_LOG)0x0; l_23 < msg_annotations; l_23 = l_23 + 1) {
              iVar3 = message_get_body_amqp_data_in_place
                                (pMStack_20,(size_t)l_23,(BINARY_DATA *)&i_1);
              if (iVar3 == 0) {
                l_24 = (LOGGER_LOG)i_1;
                binary_value_1.bytes._0_4_ = SUB84(binary_data_1.bytes,0);
                value_01.length = binary_value_1.bytes._0_4_;
                value_01.bytes = (void *)i_1;
                value_01._12_4_ = 0;
                binary_value_1._8_8_ = amqpvalue_create_data(value_01);
                if ((AMQP_VALUE)binary_value_1._8_8_ == (AMQP_VALUE)0x0) {
                  l_25 = xlogging_get_log_function();
                  if (l_25 != (LOGGER_LOG)0x0) {
                    in_stack_fffffffffffffde8 =
                         CONCAT44((int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)l_23);
                    (*l_25)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x21a,1,"Cannot create body AMQP data %u",
                            in_stack_fffffffffffffde8);
                  }
                  encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
                }
                else {
                  iVar3 = amqpvalue_encode((AMQP_VALUE)binary_value_1._8_8_,encode_bytes,&l_17);
                  if (iVar3 != 0) {
                    transfer_async_operation = (ASYNC_OPERATION_HANDLE)xlogging_get_log_function();
                    if (transfer_async_operation != (ASYNC_OPERATION_HANDLE)0x0) {
                      (*(code *)transfer_async_operation)
                                (0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                 ,"send_one_message",0x221,1,"Cannot encode body AMQP data %u",
                                 (ulong)l_23 & 0xffffffff);
                    }
                    encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
                    break;
                  }
                  amqpvalue_destroy((AMQP_VALUE)binary_value_1._8_8_);
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  in_stack_fffffffffffffde8 =
                       CONCAT44((int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)l_23);
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x20e,1,"Cannot get AMQP data %u",
                            in_stack_fffffffffffffde8);
                }
                encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
              }
            }
          }
          else if (l._4_4_ == 4) {
            iVar3 = amqpvalue_encode((AMQP_VALUE)body_data_count,encode_bytes,&l_17);
            if (iVar3 != 0) {
              binary_data_1.length = (size_t)xlogging_get_log_function();
              if ((LOGGER_LOG)binary_data_1.length != (LOGGER_LOG)0x0) {
                (*(code *)binary_data_1.length)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                           ,"send_one_message",0x1fe,1,"Cannot encode body AMQP value");
              }
              encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
            }
            log_message_chunk((MESSAGE_SENDER_INSTANCE *)pending_send_local,"Body - amqp value:",
                              (AMQP_VALUE)body_data_count);
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x1f6,1,"Unknown message type");
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
          }
        }
        pMVar1 = message_local;
        if (encoded_size._4_4_ == SEND_ONE_MESSAGE_OK) {
          *(undefined4 *)&message_local->header = 1;
          pAStack_1e8 = (message_annotations)
                        link_transfer_async((LINK_HANDLE)
                                            pending_send_local->async_operation_cancel_handler,
                                            (message_format)l,(PAYLOAD *)&l_17,1,on_delivery_settled
                                            ,message_local,
                                            (LINK_TRANSFER_RESULT *)
                                            ((long)&message_with_callback + 4),
                                            (tickcounter_ms_t)message_local->delivery_annotations);
          if (pAStack_1e8 == (message_annotations)0x0) {
            if (message_with_callback._4_4_ == 2) {
              *(undefined4 *)&pMVar1->header = 0;
              encoded_size._4_4_ = SEND_ONE_MESSAGE_BUSY;
            }
            else {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x240,1,"Error in link transfer");
              }
              encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
            }
          }
          else {
            _Var2 = is_message_in_queue((MESSAGE_SENDER_HANDLE)pending_send_local,
                                        (ASYNC_OPERATION_HANDLE)message_local);
            if (_Var2) {
              pMVar1->message_annotations = pAStack_1e8;
            }
            encoded_size._4_4_ = SEND_ONE_MESSAGE_OK;
          }
        }
        free((void *)payload.length);
        if (body_data_count != 0) {
          amqpvalue_destroy((AMQP_VALUE)body_data_count);
        }
      }
    }
    else {
      encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
    }
    if (header_amqp_value != (AMQP_VALUE)0x0) {
      header_destroy((HEADER_HANDLE)header_amqp_value);
    }
    if (properties != (PROPERTIES_HANDLE)0x0) {
      amqpvalue_destroy((AMQP_VALUE)properties);
    }
    if (pAStack_90 != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(pAStack_90);
    }
    if (application_properties_value != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(application_properties_value);
    }
    if (body_amqp_value != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(body_amqp_value);
    }
    if (application_properties != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(application_properties);
    }
    if (properties_amqp_value != (AMQP_VALUE)0x0) {
      properties_destroy((PROPERTIES_HANDLE)properties_amqp_value);
    }
  }
  else {
    header = (HEADER_HANDLE)xlogging_get_log_function();
    if (header != (HEADER_HANDLE)0x0) {
      (*(code *)header)(0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0xe4,1,
                        "Failure getting message body type and/or message format");
    }
    encoded_size._4_4_ = SEND_ONE_MESSAGE_ERROR;
  }
  return encoded_size._4_4_;
}

Assistant:

static SEND_ONE_MESSAGE_RESULT send_one_message(MESSAGE_SENDER_INSTANCE* message_sender, ASYNC_OPERATION_HANDLE pending_send, MESSAGE_HANDLE message)
{
    SEND_ONE_MESSAGE_RESULT result;

    size_t encoded_size;
    size_t total_encoded_size = 0;
    MESSAGE_BODY_TYPE message_body_type;
    message_format message_format;

    if ((message_get_body_type(message, &message_body_type) != 0) ||
        (message_get_message_format(message, &message_format) != 0))
    {
        LogError("Failure getting message body type and/or message format");
        result = SEND_ONE_MESSAGE_ERROR;
    }
    else
    {
        // header
        HEADER_HANDLE header = NULL;
        AMQP_VALUE header_amqp_value = NULL;
        PROPERTIES_HANDLE properties = NULL;
        AMQP_VALUE properties_amqp_value = NULL;
        AMQP_VALUE application_properties = NULL;
        AMQP_VALUE application_properties_value = NULL;
        AMQP_VALUE body_amqp_value = NULL;
        size_t body_data_count = 0;
        AMQP_VALUE msg_annotations = NULL;
        bool is_error = false;

        // message header
        if ((message_get_header(message, &header) == 0) &&
            (header != NULL))
        {
            header_amqp_value = amqpvalue_create_header(header);
            if (header_amqp_value == NULL)
            {
                LogError("Cannot create header AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(header_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain header encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }

        }

        // message annotations
        if ((!is_error) &&
            (message_get_message_annotations(message, &msg_annotations) == 0) &&
            (msg_annotations != NULL))
        {
            if (amqpvalue_get_encoded_size(msg_annotations, &encoded_size) != 0)
            {
                LogError("Cannot obtain message annotations encoded size");
                is_error = true;
            }
            else
            {
                total_encoded_size += encoded_size;
            }
        }

        // properties
        if ((!is_error) &&
            (message_get_properties(message, &properties) == 0) &&
            (properties != NULL))
        {
            properties_amqp_value = amqpvalue_create_properties(properties);
            if (properties_amqp_value == NULL)
            {
                LogError("Cannot create message properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(properties_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain message properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        // application properties
        if ((!is_error) &&
            (message_get_application_properties(message, &application_properties) == 0) &&
            (application_properties != NULL))
        {
            application_properties_value = amqpvalue_create_application_properties(application_properties);
            if (application_properties_value == NULL)
            {
                LogError("Cannot create application properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(application_properties_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain application properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        if (is_error)
        {
            result = SEND_ONE_MESSAGE_ERROR;
        }
        else
        {
            result = SEND_ONE_MESSAGE_OK;

            // body - amqp data
            switch (message_body_type)
            {
            default:
                LogError("Unknown body type");
                result = SEND_ONE_MESSAGE_ERROR;
                break;

            case MESSAGE_BODY_TYPE_VALUE:
            {
                AMQP_VALUE message_body_amqp_value;
                if (message_get_body_amqp_value_in_place(message, &message_body_amqp_value) != 0)
                {
                    LogError("Cannot obtain AMQP value from body");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    body_amqp_value = amqpvalue_create_amqp_value(message_body_amqp_value);
                    if (body_amqp_value == NULL)
                    {
                        LogError("Cannot create body AMQP value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        if (amqpvalue_get_encoded_size(body_amqp_value, &encoded_size) != 0)
                        {
                            LogError("Cannot get body AMQP value encoded size");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                        else
                        {
                            total_encoded_size += encoded_size;
                        }
                    }
                }

                break;
            }

            case MESSAGE_BODY_TYPE_DATA:
            {
                BINARY_DATA binary_data;
                size_t i;

                if (message_get_body_amqp_data_count(message, &body_data_count) != 0)
                {
                    LogError("Cannot get body AMQP data count");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    if (body_data_count == 0)
                    {
                        LogError("Body data count is zero");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get body AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data");
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_get_encoded_size(body_amqp_data, &encoded_size) != 0)
                                    {
                                        LogError("Cannot get body AMQP data encoded size");
                                        result = SEND_ONE_MESSAGE_ERROR;
                                    }
                                    else
                                    {
                                        total_encoded_size += encoded_size;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                    }
                }
                break;
            }
            }

            if (result == 0)
            {
                void* data_bytes = malloc(total_encoded_size);
                PAYLOAD payload;
                payload.bytes = (const unsigned char*)data_bytes;
                payload.length = 0;
                result = SEND_ONE_MESSAGE_OK;

                if (header != NULL)
                {
                    if (amqpvalue_encode(header_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode header value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Header:", header_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (msg_annotations != NULL))
                {
                    if (amqpvalue_encode(msg_annotations, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message annotations value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Message Annotations:", msg_annotations);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (properties != NULL))
                {
                    if (amqpvalue_encode(properties_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Properties:", properties_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (application_properties != NULL))
                {
                    if (amqpvalue_encode(application_properties_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode application properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Application properties:", application_properties_value);
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    switch (message_body_type)
                    {
                    default:
                        LogError("Unknown message type");
                        result = SEND_ONE_MESSAGE_ERROR;
                        break;

                    case MESSAGE_BODY_TYPE_VALUE:
                    {
                        if (amqpvalue_encode(body_amqp_value, encode_bytes, &payload) != 0)
                        {
                            LogError("Cannot encode body AMQP value");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }

                        log_message_chunk(message_sender, "Body - amqp value:", body_amqp_value);
                        break;
                    }
                    case MESSAGE_BODY_TYPE_DATA:
                    {
                        BINARY_DATA binary_data;
                        size_t i;

                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data %u", (unsigned int)i);
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_encode(body_amqp_data, encode_bytes, &payload) != 0)
                                    {
                                        LogError("Cannot encode body AMQP data %u", (unsigned int)i);
                                        result = SEND_ONE_MESSAGE_ERROR;
                                        break;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                        break;
                    }
                    }
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    ASYNC_OPERATION_HANDLE transfer_async_operation;
                    LINK_TRANSFER_RESULT link_transfer_error;
                    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
                    message_with_callback->message_send_state = MESSAGE_SEND_STATE_PENDING;

                    transfer_async_operation = link_transfer_async(message_sender->link, message_format, &payload, 1, on_delivery_settled, pending_send, &link_transfer_error, message_with_callback->timeout);
                    if (transfer_async_operation == NULL)
                    {
                        if (link_transfer_error == LINK_TRANSFER_BUSY)
                        {
                            message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                            result = SEND_ONE_MESSAGE_BUSY;
                        }
                        else
                        {
                            LogError("Error in link transfer");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                    }
                    else
                    {
                        // For messages that get atomically sent and settled by link_transfer_async,
                        // on_delivery_settled is invoked and the message destroyed.
                        // So at this point we shall verify if the message still exists and is in the queue.
                        if (is_message_in_queue(message_sender, pending_send))
                        {
                            message_with_callback->transfer_async_operation = transfer_async_operation;
                        }

                        result = SEND_ONE_MESSAGE_OK;
                    }
                }

                free(data_bytes);

                if (body_amqp_value != NULL)
                {
                    amqpvalue_destroy(body_amqp_value);
                }
            }
        }

        if (header != NULL)
        {
            header_destroy(header);
        }

        if (header_amqp_value != NULL)
        {
            amqpvalue_destroy(header_amqp_value);
        }

        if (msg_annotations != NULL)
        {
            annotations_destroy(msg_annotations);
        }

        if (application_properties != NULL)
        {
            amqpvalue_destroy(application_properties);
        }

        if (application_properties_value != NULL)
        {
            amqpvalue_destroy(application_properties_value);
        }

        if (properties_amqp_value != NULL)
        {
            amqpvalue_destroy(properties_amqp_value);
        }

        if (properties != NULL)
        {
            properties_destroy(properties);
        }
    }

    return result;
}